

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~PosixSequentialFile(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x30);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }